

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O1

Result wabt::ParseDouble(LiteralType literal_type,char *s,char *end,uint64_t *out_bits)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  Result RVar4;
  char *pcVar5;
  uint64_t uVar6;
  byte bVar7;
  char cVar8;
  ulong uVar9;
  ulong unaff_RBP;
  uint uVar10;
  char *pcVar11;
  byte *pbVar12;
  byte *pbVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  int iVar17;
  char *pcVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  
  switch(literal_type) {
  case Int:
  case Float:
    RVar4 = anon_unknown_0::FloatParser<double>::ParseFloat(s,end,out_bits);
    return (Result)RVar4.enum_;
  case Hexfloat:
    cVar1 = *s;
    pcVar11 = s + ((cVar1 - 0x2bU & 0xfd) == 0);
    if (pcVar11 < end) {
      lVar16 = 0;
      do {
        pcVar5 = "";
        if (lVar16 == 2) break;
        if (pcVar11[lVar16] != ":0x"[lVar16 + 1]) goto LAB_00137346;
        lVar19 = lVar16 + 1;
        lVar16 = lVar16 + 1;
        pcVar5 = end + (long)(":0x" + (1 - (long)pcVar11));
      } while (pcVar11 + lVar19 != end);
    }
    else {
      pcVar5 = "0x";
    }
    if (*pcVar5 != '\0') {
LAB_00137346:
      __assert_fail("StringStartsWith(s, end, \"0x\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/literal.cc"
                    ,0x107,
                    "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseHex(const char *, const char *, Uint *) [T = double]"
                   );
    }
    pbVar12 = (byte *)(pcVar11 + 2);
    bVar23 = pbVar12 < end;
    if (bVar23) {
      bVar24 = false;
      bVar23 = true;
      iVar21 = 0;
      uVar14 = 0;
      bVar3 = false;
      do {
        bVar7 = *pbVar12;
        if (bVar7 == 0x2e) {
          bVar24 = true;
LAB_00136f37:
          bVar2 = false;
        }
        else {
          if (bVar7 == 0x5f) goto LAB_00136f37;
          iVar20 = (int)(char)bVar7;
          bVar2 = true;
          bVar22 = true;
          uVar9 = (ulong)(iVar20 - 0x30U);
          if (9 < iVar20 - 0x30U) {
            if (iVar20 - 0x61U < 6) {
              uVar9 = (ulong)(iVar20 - 0x57);
            }
            else {
              bVar22 = iVar20 - 0x41U < 6;
              uVar10 = (uint)unaff_RBP;
              if (bVar22) {
                uVar10 = iVar20 - 0x37;
              }
              uVar9 = (ulong)uVar10;
            }
          }
          unaff_RBP = uVar9;
          if (bVar22) {
            if (uVar14 < 0x20000000000000) {
              uVar14 = uVar14 * 0x10 + unaff_RBP;
              iVar20 = iVar21 + -4;
              if (!bVar24) {
                iVar20 = iVar21;
              }
            }
            else {
              bVar2 = true;
              if ((int)unaff_RBP == 0) {
                bVar2 = bVar3;
              }
              if (bVar3) {
                bVar2 = bVar3;
              }
              iVar20 = iVar21 + 4;
              bVar3 = bVar2;
              if (bVar24) {
                iVar20 = iVar21;
              }
            }
            bVar2 = false;
            iVar21 = iVar20;
          }
        }
        pbVar13 = pbVar12;
        if (bVar2) break;
        pbVar12 = pbVar12 + 1;
        bVar23 = pbVar12 < end;
        pbVar13 = (byte *)end;
      } while (bVar23);
    }
    else {
      bVar3 = false;
      uVar14 = 0;
      iVar21 = 0;
      pbVar13 = pbVar12;
    }
    if (uVar14 != 0) {
      iVar20 = 0;
      bVar24 = false;
      if (bVar23) {
        if ((*pbVar13 | 0x20) != 0x70) {
          __assert_fail("*s == \'p\' || *s == \'P\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/literal.cc"
                        ,0x137,
                        "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseHex(const char *, const char *, Uint *) [T = double]"
                       );
        }
        iVar20 = 0;
        pbVar12 = pbVar13 + 1;
        iVar17 = 0;
        if (pbVar13[1] == 0x2b) {
          pbVar12 = pbVar13 + 2;
          iVar17 = iVar21;
        }
        bVar24 = pbVar13[1] == 0x2d;
        if (bVar24) {
          pbVar12 = pbVar13 + 2;
          iVar17 = -iVar21;
        }
        if (pbVar12 < end) {
          iVar20 = 0;
          do {
            if ((char)*pbVar12 != 0x5f) {
              uVar10 = (int)(char)*pbVar12 - 0x30;
              if (9 < uVar10) {
                __assert_fail("digit <= 9",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/literal.cc"
                              ,0x14c,
                              "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseHex(const char *, const char *, Uint *) [T = double]"
                             );
              }
              iVar20 = uVar10 + iVar20 * 10;
              if (0x3ff < iVar20 + iVar17) break;
            }
            pbVar12 = pbVar12 + 1;
          } while (pbVar12 != (byte *)end);
        }
      }
      iVar17 = -iVar20;
      if (!bVar24) {
        iVar17 = iVar20;
      }
      uVar9 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = uVar9 ^ 0x3f;
      iVar21 = iVar21 - (int)uVar9;
      iVar20 = iVar17 + iVar21 + 0x3f;
      iVar17 = iVar17 + iVar21;
      cVar8 = (char)uVar9;
      if (-0x3ff < iVar20) {
        if (uVar14 >> 0x35 == 0) {
          if (uVar9 != 0xb) {
            uVar14 = uVar14 << (cVar8 - 0xbU & 0x3f);
          }
        }
        else {
          lVar19 = 1L << (10U - cVar8 & 0x3f);
          lVar16 = 0;
          if (bVar3) {
            lVar16 = lVar19;
          }
          if ((uVar14 >> ((ulong)(byte)(0xbU - cVar8) & 0x3f) & 1) != 0) {
            lVar16 = lVar19;
          }
          uVar14 = lVar16 + uVar14 >> (0xbU - cVar8 & 0x3f);
          if (0x1fffffffffffff < uVar14) {
            iVar20 = iVar17 + 0x40;
          }
        }
        if (iVar20 < 0x400) {
          *out_bits = (ulong)(iVar20 + 0x3ff) << 0x34 |
                      (ulong)(cVar1 == '-') << 0x3f | uVar14 & 0xfffffffffffff;
          return (Result)Ok;
        }
        return (Result)Error;
      }
      if (uVar14 >> 0x34 == 0) {
        if (uVar9 != 0xc) {
          uVar14 = uVar14 << (cVar8 - 0xcU & 0x3f);
        }
      }
      else {
        bVar3 = (bool)(bVar3 | (uVar14 & ~(-1L << (0xbU - cVar8 & 0x3f))) != 0);
        uVar14 = uVar14 >> (0xcU - cVar8 & 0x3f);
      }
      if (-0x434 < iVar20) {
        if (iVar20 != -0x3ff) {
          bVar7 = -(char)iVar17 - 0x3f;
          lVar19 = 1L << (bVar7 & 0x3f);
          lVar16 = 0;
          if (bVar3) {
            lVar16 = lVar19;
          }
          if ((uVar14 & (~(-1L << (bVar7 & 0x3f)) | 1L << ((ulong)(-iVar17 - 0x43eU) & 0x3f))) != 0)
          {
            lVar16 = lVar19;
          }
          uVar14 = lVar16 + uVar14 >> ((byte)(-iVar17 - 0x43eU) & 0x3f) & 0xfffffffffffff;
        }
        if (uVar14 != 0) {
          if (0xfffffffffffff < uVar14) goto LAB_001373c7;
          pcVar15 = (char *)(uVar14 | (ulong)(cVar1 == '-') << 0x3f);
          goto LAB_001370d4;
        }
      }
    }
    uVar6 = (ulong)(cVar1 == '-') << 0x3f;
    break;
  case Infinity:
    pcVar11 = s + ((*s - 0x2bU & 0xfd) == 0);
    if (pcVar11 < end) {
      lVar16 = 0;
      do {
        pcVar5 = "";
        if (lVar16 == 3) break;
        if (pcVar11[lVar16] != "inf"[lVar16]) goto LAB_00137365;
        lVar19 = lVar16 + 1;
        lVar16 = lVar16 + 1;
        pcVar5 = "inf" + ((long)end - (long)pcVar11);
      } while (pcVar11 + lVar19 != end);
    }
    else {
      pcVar5 = "inf";
    }
    if (*pcVar5 != '\0') {
LAB_00137365:
      __assert_fail("StringStartsWith(s, end, \"inf\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/literal.cc"
                    ,0x1a4,
                    "static void wabt::(anonymous namespace)::FloatParser<double>::ParseInfinity(const char *, const char *, Uint *) [T = double]"
                   );
    }
    uVar6 = ((ulong)(*s != '-') << 0x3f) + 0xfff0000000000000;
    break;
  case Nan:
    pcVar11 = s + ((*s - 0x2bU & 0xfd) == 0);
    if (pcVar11 < end) {
      lVar16 = 0;
      do {
        pcVar5 = "";
        if (lVar16 == 3) break;
        if (pcVar11[lVar16] != "nan"[lVar16]) goto LAB_00137327;
        lVar19 = lVar16 + 1;
        lVar16 = lVar16 + 1;
        pcVar5 = "nan" + ((long)end - (long)pcVar11);
      } while (pcVar11 + lVar19 != end);
    }
    else {
      pcVar5 = "nan";
    }
    if (*pcVar5 != '\0') {
LAB_00137327:
      __assert_fail("StringStartsWith(s, end, \"nan\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/literal.cc"
                    ,0xd9,
                    "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseNan(const char *, const char *, Uint *) [T = double]"
                   );
    }
    pcVar5 = pcVar11 + 3;
    if (pcVar5 == end) {
      pcVar15 = (char *)0x8000000000000;
    }
    else {
      if (pcVar5 < end) {
        lVar16 = 0;
        do {
          pcVar15 = "";
          if (lVar16 == 3) break;
          if (pcVar5[lVar16] != ":0x"[lVar16]) goto LAB_00137384;
          lVar19 = lVar16 + 1;
          lVar16 = lVar16 + 1;
          pcVar15 = ":0x" + ((long)end - (long)pcVar5);
        } while (pcVar5 + lVar19 != end);
      }
      else {
        pcVar15 = ":0x";
      }
      if (*pcVar15 != '\0') {
LAB_00137384:
        __assert_fail("StringStartsWith(s, end, \":0x\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/literal.cc"
                      ,0xdf,
                      "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseNan(const char *, const char *, Uint *) [T = double]"
                     );
      }
      pcVar15 = (char *)0x0;
      for (pcVar11 = pcVar11 + 6; pcVar11 < end; pcVar11 = pcVar11 + 1) {
        iVar21 = (int)*pcVar11;
        if (iVar21 == 0x5f) {
          pcVar18 = (char *)((ulong)pcVar5 & 0xffffffff);
        }
        else {
          pcVar18 = (char *)(ulong)(iVar21 - 0x30U);
          bVar23 = true;
          if (9 < iVar21 - 0x30U) {
            if (iVar21 - 0x61U < 6) {
              pcVar18 = (char *)(ulong)(iVar21 - 0x57);
            }
            else {
              bVar23 = iVar21 - 0x41U < 6;
              uVar10 = (uint)pcVar5;
              if (bVar23) {
                uVar10 = iVar21 - 0x37;
              }
              pcVar18 = (char *)(ulong)uVar10;
            }
          }
          pcVar15 = pcVar18 + (long)pcVar15 * 0x10;
          if (!bVar23) {
            return (Result)Error;
          }
          if ((char *)0xfffffffffffff < pcVar15) {
            return (Result)Error;
          }
        }
        pcVar5 = pcVar18;
      }
      if (pcVar15 == (char *)0x0) {
        return (Result)Error;
      }
    }
    if ((char *)0xfffffffffffff < pcVar15) {
LAB_001373c7:
      __assert_fail("sig <= Traits::kSigMask",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/literal.cc"
                    ,0xb9,
                    "static typename FloatParser<T>::Uint wabt::(anonymous namespace)::FloatParser<double>::Make(bool, int, Uint) [T = double]"
                   );
    }
    pcVar15 = pcVar15 + ((ulong)(*s != '-') << 0x3f) + -0x10000000000000;
LAB_001370d4:
    *out_bits = (uint64_t)pcVar15;
    return (Result)Ok;
  default:
    abort();
  }
  *out_bits = uVar6;
  return (Result)Ok;
}

Assistant:

Result FloatParser<T>::Parse(LiteralType literal_type,
                             const char* s,
                             const char* end,
                             Uint* out_bits) {
#if COMPILER_IS_MSVC
  if (literal_type == LiteralType::Int && StringStartsWith(s, end, "0x")) {
    // Some MSVC crt implementation of strtof doesn't support hex strings
    literal_type = LiteralType::Hexfloat;
  }
#endif
  switch (literal_type) {
    case LiteralType::Int:
    case LiteralType::Float:
      return ParseFloat(s, end, out_bits);

    case LiteralType::Hexfloat:
      return ParseHex(s, end, out_bits);

    case LiteralType::Infinity:
      ParseInfinity(s, end, out_bits);
      return Result::Ok;

    case LiteralType::Nan:
      return ParseNan(s, end, out_bits);
  }

  WABT_UNREACHABLE;
}